

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::do_connect_boost(torrent *this)

{
  byte bVar1;
  peer_list *this_00;
  session_interface *psVar2;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint32_t uVar8;
  undefined4 extraout_var;
  torrent_peer *this_01;
  endpoint *ep;
  address *addr;
  uint uVar9;
  uint uVar10;
  __weak_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> local_210 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_208;
  string local_200;
  string local_1e0;
  address local_1c0;
  address local_1a0;
  torrent_state st;
  aux local_cc [28];
  external_ip local_b0;
  
  bVar1 = this->m_connect_boost_counter;
  if (bVar1 != 0) {
    iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x2e])();
    iVar6 = session_settings::get_int((session_settings *)CONCAT44(extraout_var,iVar6),0x4055);
    iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x1e])();
    uVar9 = iVar6 - iVar7;
    if ((uVar9 != 0) &&
       ((this->super_torrent_hot_members).m_peer_list._M_t.
        super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
        ._M_t.
        super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
        .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl != (peer_list *)0x0
       )) {
      uVar10 = (uint)bVar1;
      if ((int)uVar9 < (int)(uint)bVar1) {
        uVar10 = uVar9;
      }
      while( true ) {
        bVar5 = want_peers(this);
        if ((!bVar5) || ((int)uVar10 < 1)) break;
        this->m_connect_boost_counter = this->m_connect_boost_counter + 0xff;
        get_peer_list_state(&st,this);
        this_00 = (this->super_torrent_hot_members).m_peer_list._M_t.
                  super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                  .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
        uVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0xf])();
        this_01 = peer_list::connect_one_peer(this_00,uVar9 & 0xffff,&st);
        peers_erased(this,&st.erased);
        inc_stats_counter(this,0x34,st.loop_counter);
        if (this_01 != (torrent_peer *)0x0) {
          iVar6 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
          if ((char)iVar6 != '\0') {
            (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [3])(&local_b0);
            torrent_peer::ip((endpoint *)local_cc,this_01);
            print_endpoint_abi_cxx11_(&local_1e0,local_cc,ep);
            _Var4._M_p = local_1e0._M_dataplus._M_p;
            uVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                      _vptr_session_logger[0x20])();
            uVar8 = torrent_peer::rank(this_01,&local_b0,uVar9 & 0xffff);
            torrent_peer::address(this_01);
            external_ip::external_address(&local_1a0,&local_b0,&local_1c0);
            print_address_abi_cxx11_(&local_200,(aux *)&local_1a0,addr);
            _Var3._M_p = local_200._M_dataplus._M_p;
            uVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                      _vptr_session_logger[0xf])();
            (*(this->super_request_callback)._vptr_request_callback[7])
                      (this," *** FOUND CONNECTION CANDIDATE [ ip: %s rank: %u external: %s t: %d ]"
                       ,_Var4._M_p,(ulong)uVar8,_Var3._M_p,
                       (ulong)((uVar9 & 0xffff) - (uint)this_01->last_connected));
            ::std::__cxx11::string::~string((string *)&local_200);
            ::std::__cxx11::string::~string((string *)&local_1e0);
          }
          bVar5 = connect_to_peer(this,this_01,false);
          if (bVar5) {
            (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x40])();
          }
          else {
            peer_list::inc_failcount
                      ((this->super_torrent_hot_members).m_peer_list._M_t.
                       super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                       .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl,
                       this_01);
          }
        }
        update_want_peers(this);
        ::std::
        _Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
        ::~_Vector_base(&st.erased.
                         super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       );
        uVar10 = uVar10 - 1;
      }
      bVar5 = want_peers(this);
      if (bVar5) {
        psVar2 = (this->super_torrent_hot_members).m_ses;
        ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libtorrent::aux::torrent,void>
                  ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&st,
                   (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
        ::std::__weak_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
        __weak_ptr<libtorrent::aux::torrent,void>
                  (local_210,
                   (__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&st);
        (*(psVar2->super_session_logger)._vptr_session_logger[0x2b])(psVar2,local_210);
        ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_208);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&st.min_reconnect_time);
      }
    }
  }
  return;
}

Assistant:

void torrent::do_connect_boost()
	{
		if (m_connect_boost_counter == 0) return;

		// this is the first tracker response for this torrent
		// instead of waiting one second for session_impl::on_tick()
		// to be called, connect to a few peers immediately
		int conns = std::min(int(m_connect_boost_counter)
			, settings().get_int(settings_pack::connections_limit) - m_ses.num_connections());

		if (conns == 0) return;

		// if we don't know of any peers
		if (!m_peer_list) return;

		while (want_peers() && conns > 0)
		{
			TORRENT_ASSERT(m_connect_boost_counter > 0);
			--conns;
			--m_connect_boost_counter;
			torrent_state st = get_peer_list_state();
			torrent_peer* p = m_peer_list->connect_one_peer(m_ses.session_time(), &st);
			peers_erased(st.erased);
			inc_stats_counter(counters::connection_attempt_loops, st.loop_counter);
			if (p == nullptr)
			{
				update_want_peers();
				continue;
			}

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				external_ip const& external = m_ses.external_address();
				debug_log(" *** FOUND CONNECTION CANDIDATE ["
					" ip: %s rank: %u external: %s t: %d ]"
					, print_endpoint(p->ip()).c_str()
					, p->rank(external, m_ses.listen_port())
					, print_address(external.external_address(p->address())).c_str()
					, int(m_ses.session_time() - p->last_connected));
			}
#endif

			if (!connect_to_peer(p))
			{
				m_peer_list->inc_failcount(p);
				update_want_peers();
			}
			else
			{
				// increase m_ses.m_boost_connections for each connection
				// attempt. This will be deducted from the connect speed
				// the next time session_impl::on_tick() is triggered
				m_ses.inc_boost_connections();
				update_want_peers();
			}
		}

		if (want_peers()) m_ses.prioritize_connections(shared_from_this());
	}